

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O1

void bloaty::wasm::ReadNames
               (Section *section,IndexedNames *func_names,IndexedNames *dataseg_names,
               RangeSink *sink)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  size_type __rlen;
  uint64_t uVar4;
  uint64_t uVar5;
  char *pcVar6;
  uint64_t uVar7;
  char *pcVar8;
  mapped_type *this;
  char *pcVar9;
  char *filesize;
  uint uVar10;
  string_view name;
  string_view section_1;
  string_view data;
  string_view local_a8;
  string_view local_98;
  key_type local_7c;
  RangeSink *local_78;
  _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_70;
  _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_68;
  _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_60;
  uint64_t local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_98._M_len = (section->contents)._M_len;
  local_98._M_str = (section->contents)._M_str;
  if ((char *)local_98._M_len != (char *)0x0) {
    local_78 = sink;
    local_70 = (_Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)func_names;
    local_68 = (_Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)dataseg_names;
    do {
      uVar4 = ReadLEB128Internal(false,7,&local_98);
      uVar5 = ReadLEB128Internal(false,0x20,&local_98);
      pcVar6 = (char *)(uVar5 & 0xffffffff);
      pcVar9 = (char *)(local_98._M_len + -(long)pcVar6);
      if (local_98._M_len < pcVar6) {
LAB_001a1e01:
        Throw("premature EOF reading variable-length DWARF data",0x47);
      }
      pcVar8 = local_98._M_str + (long)pcVar6;
      local_a8._M_str = local_98._M_str;
      local_a8._M_len = (size_t)pcVar6;
      local_98._M_len = (size_t)pcVar9;
      local_98._M_str = pcVar8;
      if (((byte)((byte)uVar4 | 8) == 9) &&
         (uVar5 = ReadLEB128Internal(false,0x20,&local_a8), (int)uVar5 != 0)) {
        local_60 = local_68;
        if ((byte)uVar4 == 1) {
          local_60 = local_70;
        }
        do {
          pcVar6 = local_a8._M_str;
          sVar2 = local_a8._M_len;
          uVar4 = ReadLEB128Internal(false,0x20,&local_a8);
          uVar7 = ReadLEB128Internal(false,0x20,&local_a8);
          pcVar9 = local_a8._M_str;
          name._M_len = (char *)(uVar7 & 0xffffffff);
          pcVar8 = (char *)(local_a8._M_len + -(long)name._M_len);
          if (local_a8._M_len < name._M_len) goto LAB_001a1e01;
          pcVar1 = local_a8._M_str + (long)name._M_len;
          filesize = local_a8._M_str + ((long)name._M_len - (long)pcVar6);
          local_a8._M_len = (size_t)pcVar8;
          local_58 = uVar5;
          if (sVar2 < filesize) {
            local_a8._M_str = pcVar1;
            Throw("region out-of-bounds",0x5d);
          }
          pcVar8 = (local_78->file_->data_)._M_str;
          pcVar3 = pcVar1;
          if ((pcVar8 <= pcVar6) && (pcVar6 < pcVar8 + (local_78->file_->data_)._M_len)) {
            name._M_str = local_a8._M_str;
            local_a8._M_str = pcVar1;
            RangeSink::AddFileRange
                      (local_78,"wasm_funcname",name,(long)pcVar6 - (long)pcVar8,(uint64_t)filesize)
            ;
            pcVar3 = local_a8._M_str;
          }
          local_a8._M_str = pcVar3;
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar9,pcVar1);
          local_7c = (key_type)uVar4;
          this = std::__detail::
                 _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](local_60,&local_7c);
          std::__cxx11::string::operator=((string *)this,(string *)local_50);
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          uVar10 = (int)local_58 - 1;
          uVar5 = (uint64_t)uVar10;
        } while (uVar10 != 0);
      }
    } while ((char *)local_98._M_len != (char *)0x0);
  }
  return;
}

Assistant:

void ReadNames(const Section& section, IndexedNames* func_names,
               IndexedNames* dataseg_names, RangeSink* sink) {
  enum class NameType {
    kModule = 0,
    kFunction = 1,
    kLocal = 2,
    kLabel = 3,
    kType = 4,
    kTable = 5,
    kMemory = 6,
    kGlobal = 7,
    kElemSegment = 8,
    kDataSegment = 9
  };

  string_view data = section.contents;

  while (!data.empty()) {
    NameType type = static_cast<NameType>(ReadVarUInt7(&data));
    uint32_t size = ReadVarUInt32(&data);
    string_view section = ReadPiece(size, &data);

    if (type == NameType::kFunction || type == NameType::kDataSegment) {
      uint32_t count = ReadVarUInt32(&section);
      for (uint32_t i = 0; i < count; i++) {
        string_view entry = section;
        uint32_t index = ReadVarUInt32(&section);
        uint32_t name_len = ReadVarUInt32(&section);
        string_view name = ReadPiece(name_len, &section);
        entry = StrictSubstr(entry, 0, name.data() - entry.data() + name.size());
        sink->AddFileRange("wasm_funcname", name, entry);
        IndexedNames *names = (type == NameType::kFunction ? func_names : dataseg_names);
        (*names)[index] = std::string(name);
      }
    }
  }
}